

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qjpeghandler.cpp
# Opt level: O1

bool read_jpeg_image(QImage *outImage,QSize scaledSize,QRect scaledClipRect,QRect clipRect,
                    int quality,Rgb888ToRgb32Converter converter,j_decompress_ptr info,
                    my_error_mgr *err,bool invertCMYK)

{
  undefined4 uVar1;
  undefined4 uVar2;
  bool bVar3;
  bool bVar4;
  Representation RVar5;
  QRect QVar6;
  QRect QVar7;
  QRect QVar8;
  undefined1 auVar9 [16];
  char cVar10;
  byte bVar11;
  int iVar12;
  uint uVar13;
  int iVar14;
  Representation RVar15;
  JSAMPARRAY ppJVar16;
  long lVar17;
  quint32 *pqVar18;
  void *__dest;
  uint uVar19;
  undefined8 uVar20;
  Format FVar21;
  uint uVar22;
  uint uVar23;
  uint uVar24;
  AspectRatioMode AVar25;
  QSize QVar26;
  int iVar27;
  JSAMPROW pJVar28;
  long in_FS_OFFSET;
  double dVar29;
  Representation RVar32;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  Representation RVar33;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  QRect QVar40;
  uchar *row;
  QRect local_c0;
  undefined8 local_b0;
  QRect local_a8;
  QRect local_98;
  QRect local_88;
  QRect local_78;
  QSize local_60;
  code *local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  long local_38;
  
  local_88._8_8_ = clipRect._8_8_;
  local_88._0_8_ = clipRect._0_8_;
  uVar20 = scaledClipRect._8_8_;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_78.x1 = scaledClipRect.x1.m_i;
  local_78.y1 = scaledClipRect.y1.m_i;
  local_78.x2 = scaledClipRect.x2.m_i;
  local_78.y2 = scaledClipRect.y2.m_i;
  local_60 = scaledSize;
  iVar12 = _setjmp((__jmp_buf_tag *)err->setjmp_buffer);
  QVar8.x2.m_i = local_88.x2.m_i;
  QVar8.y2.m_i = local_88.y2.m_i;
  QVar8.x1.m_i = local_88.x1.m_i;
  QVar8.y1.m_i = local_88.y1.m_i;
  QVar7.x2.m_i = local_88.x2.m_i;
  QVar7.y2.m_i = local_88.y2.m_i;
  QVar7.x1.m_i = local_88.x1.m_i;
  QVar7.y1.m_i = local_88.y1.m_i;
  QVar6.x2.m_i = local_88.x2.m_i;
  QVar6.y2.m_i = local_88.y2.m_i;
  QVar6.x1.m_i = local_88.x1.m_i;
  QVar6.y1.m_i = local_88.y1.m_i;
  QVar40.x2.m_i = local_88.x2.m_i;
  QVar40.y2.m_i = local_88.y2.m_i;
  QVar40.x1.m_i = local_88.x1.m_i;
  QVar40.y1.m_i = local_88.y1.m_i;
  if (iVar12 == 0) {
    uVar22 = 0x4b;
    if (-1 < quality) {
      uVar22 = quality;
    }
    auVar39._0_4_ = -(uint)(local_78.x2.m_i < local_78.x1.m_i);
    auVar39._4_4_ = -(uint)(local_78.x2.m_i < local_78.x1.m_i);
    auVar39._8_4_ = -(uint)(local_78.y2.m_i < local_78.y1.m_i);
    auVar39._12_4_ = -(uint)(local_78.y2.m_i < local_78.y1.m_i);
    uVar13 = movmskpd(quality,auVar39);
    if (uVar13 == 0) {
      bVar3 = local_60.wd.m_i < 1;
      bVar4 = local_60.ht.m_i < 1;
      RVar33.m_i = local_88.x1.m_i;
      RVar5.m_i = local_88.y1.m_i;
      if (bVar4 || bVar3) {
        auVar34._0_4_ = -(uint)(local_88.x2.m_i < RVar33.m_i);
        iVar12 = -(uint)(local_88.y2.m_i < RVar5.m_i);
        auVar34._4_4_ = auVar34._0_4_;
        auVar34._8_4_ = iVar12;
        auVar34._12_4_ = iVar12;
        iVar12 = movmskpd((int)CONCAT71((int7)((ulong)uVar20 >> 8),bVar3),auVar34);
        if (iVar12 == 0) {
          if (!bVar4 && !bVar3) goto LAB_001063f7;
          local_78.x1.m_i = RVar33.m_i + local_78.x1.m_i;
          local_78.y1.m_i = RVar5.m_i + local_78.y1.m_i;
          local_78.x2.m_i = RVar33.m_i + local_78.x2.m_i;
          local_78.y2.m_i = RVar5.m_i + local_78.y2.m_i;
          QVar40 = (QRect)QRect::operator&(&local_78,&local_88);
        }
        else {
          QVar40.y1.m_i = local_78.y1.m_i;
          QVar40.x1.m_i = local_78.x1.m_i;
          QVar40.y2.m_i = local_78.y2.m_i;
          QVar40.x2.m_i = local_78.x2.m_i;
        }
LAB_001063de:
        local_78.x1.m_i = 0;
        uVar13 = 0;
        local_78.y1.m_i = 0;
        local_78.x2.m_i = -1;
        local_78.y2.m_i = -1;
      }
      else {
LAB_001063f7:
        auVar35._0_4_ = -(uint)(local_88.x2.m_i < RVar33.m_i);
        iVar12 = -(uint)(local_88.y2.m_i < RVar5.m_i);
        auVar35._4_4_ = auVar35._0_4_;
        auVar35._8_4_ = iVar12;
        auVar35._12_4_ = iVar12;
        uVar13 = movmskpd((uint)(bVar4 || bVar3),auVar35);
        QVar40 = QVar6;
        if (uVar13 != 0) {
          uVar19 = info->image_width;
          uVar13 = (uint)((ulong)uVar19 / ((ulong)local_60 & 0xffffffff));
          QVar40 = QVar7;
          if (uVar19 % (uint)local_60.wd.m_i == 0) {
            uVar23 = info->image_height;
            uVar13 = uVar23 / (uint)local_60.ht.m_i;
            QVar40 = QVar8;
            if (uVar23 % (uint)local_60.ht.m_i == 0) {
              QVar40.x2.m_i = (uVar19 * (local_78.x2.m_i + 1)) / (uint)local_60.wd.m_i - 1;
              QVar40.y2.m_i = (uVar23 * (local_78.y2.m_i + 1)) / (uint)local_60.ht.m_i - 1;
              QVar40.x1.m_i = (uVar19 * local_78.x1.m_i) / local_60.wd.m_i;
              QVar40.y1.m_i = (uVar23 * local_78.y1.m_i) / local_60.ht.m_i;
              local_60.ht.m_i = (local_78.y2.m_i + 1) - local_78.y1.m_i;
              local_60.wd.m_i = (local_78.x2.m_i + 1) - local_78.x1.m_i;
              goto LAB_001063de;
            }
          }
        }
      }
    }
    RVar15 = local_60.wd.m_i;
    RVar32 = local_60.ht.m_i;
    auVar36._0_4_ = -(uint)(0 < RVar15.m_i);
    auVar36._4_4_ = -(uint)(0 < RVar15.m_i);
    auVar36._8_4_ = -(uint)(0 < RVar32.m_i);
    auVar36._12_4_ = -(uint)(0 < RVar32.m_i);
    iVar12 = movmskpd(uVar13,auVar36);
    if (((iVar12 == 3) && (info->image_width != 0)) && (info->image_height != 0)) {
      local_88.x1 = QVar40.x1.m_i;
      local_88.y1 = QVar40.y1.m_i;
      local_88.x2 = QVar40.x2.m_i;
      local_88.y2 = QVar40.y2.m_i;
      if (local_88.y2.m_i < local_88.y1.m_i || local_88.x2.m_i < local_88.x1.m_i) {
        auVar37._4_4_ = 0;
        auVar37._0_4_ = info->image_width;
        auVar37._8_4_ = info->image_height;
        auVar37._12_4_ = 0;
        auVar38._0_8_ = SUB168(auVar37 | _DAT_0010a0a0,0) - (double)DAT_0010a0a0;
        auVar38._8_8_ = SUB168(auVar37 | _DAT_0010a0a0,8) - DAT_0010a0a0._8_8_;
        auVar30._0_8_ = (double)RVar15.m_i;
        auVar30._8_8_ = (double)RVar32.m_i;
        auVar39 = divpd(auVar38,auVar30);
        dVar29 = auVar39._0_8_;
        if (auVar39._8_8_ <= auVar39._0_8_) {
          dVar29 = auVar39._8_8_;
        }
        local_88 = QVar40;
        dVar29 = ceil(8.0 / dVar29);
        uVar13 = (uint)dVar29;
        if (7 < (int)uVar13) {
          uVar13 = 8;
        }
        uVar19 = 1;
        if (1 < (int)uVar13) {
          uVar19 = uVar13;
        }
        info->scale_num = uVar19;
        info->scale_denom = 8;
        QVar40 = local_88;
      }
      else {
        uVar19 = (local_88.x2.m_i - local_88.x1.m_i) + 1;
        uVar24 = (int)uVar19 / RVar15.m_i;
        uVar23 = (local_88.y2.m_i - local_88.y1.m_i) + 1;
        uVar13 = (int)uVar23 / RVar32.m_i;
        if ((int)uVar24 < (int)uVar13) {
          uVar13 = uVar24;
        }
        info->scale_denom = uVar13;
        uVar24 = 1;
        if ((1 < uVar13) && (uVar24 = 2, 3 < uVar13)) {
          uVar24 = (uint)(7 < uVar13) * 4 + 4;
        }
        info->scale_denom = uVar24;
        info->scale_num = 1;
        if (1 < uVar24) {
          do {
            uVar13 = uVar24 - 1;
            if ((((local_88.x1.m_i & uVar13) == 0) && ((local_88.y1.m_i & uVar13) == 0)) &&
               (((uVar19 & uVar13) == 0 && ((uVar23 & uVar13) == 0)))) break;
            info->scale_denom = uVar24 >> 1;
            bVar3 = 3 < uVar24;
            uVar24 = uVar24 >> 1;
          } while (bVar3);
        }
      }
    }
    if (uVar22 < 0x32) {
      info->dct_method = JDCT_IFAST;
      info->do_fancy_upsampling = 0;
    }
    local_88 = QVar40;
    jpeg_calc_output_dimensions(info);
    local_98.x1.m_i = 0;
    local_98.y1.m_i = 0;
    uVar1 = info->output_width;
    uVar2 = info->output_height;
    local_98._8_8_ = CONCAT44(uVar2 + -1,uVar1 + -1);
    local_a8.x1.m_i = 0;
    local_a8.y1.m_i = 0;
    local_a8.x2.m_i = -1;
    local_a8.y2.m_i = -1;
    if (local_88.y2.m_i < local_88.y1.m_i || local_88.x2.m_i < local_88.x1.m_i) {
      auVar9._8_8_ = 0;
      auVar9._0_8_ = local_98._8_8_;
      local_a8 = (QRect)(auVar9 << 0x40);
    }
    else {
      uVar22 = info->scale_denom;
      if (uVar22 == info->scale_num) {
        local_a8 = (QRect)QRect::operator&(&local_88,&local_98);
      }
      else {
        local_a8.y1.m_i = local_88.y1.m_i / (int)uVar22;
        local_a8.x1.m_i = local_88.x1.m_i / (int)uVar22;
        local_a8.y2.m_i =
             local_88.y1.m_i / (int)uVar22 + -1 +
             ((local_88.y2.m_i - local_88.y1.m_i) + 1) / (int)uVar22;
        local_a8.x2.m_i =
             local_88.x1.m_i / (int)uVar22 + -1 +
             ((local_88.x2.m_i - local_88.x1.m_i) + 1) / (int)uVar22;
        local_a8 = (QRect)QRect::operator&(&local_a8,&local_98);
      }
    }
    iVar12 = info->output_components;
    if (iVar12 == 1) {
      FVar21 = Format_Grayscale8;
    }
    else if (iVar12 == 4) {
      FVar21 = (uint)(info->out_color_space == JCS_CMYK) << 5 | Format_RGB32;
    }
    else {
      if (iVar12 != 3) goto LAB_001062f5;
      FVar21 = Format_RGB32;
    }
    QVar26.ht.m_i = (local_a8.y2.m_i - local_a8.y1.m_i) + 1;
    QVar26.wd.m_i = (local_a8.x2.m_i - local_a8.x1.m_i) + 1;
    cVar10 = QImageIOHandler::allocateImage(QVar26,FVar21,outImage);
    if (cVar10 != '\0') {
      AVar25 = (AspectRatioMode)outImage;
      if (info->output_components == 1) {
        if (local_a8.x1.m_i != local_98.x1.m_i) goto LAB_00106791;
        if (local_a8.x2.m_i != local_98.x2.m_i) goto LAB_00106791;
        if (local_a8.y1.m_i != local_98.y1.m_i) goto LAB_00106791;
        if (local_a8.y2.m_i != local_98.y2.m_i) goto LAB_00106791;
        jpeg_start_decompress(info);
        if (info->output_scanline < info->output_height) {
          do {
            local_58 = (code *)QImage::scanLine(AVar25);
            jpeg_read_scanlines(info,&local_58,1);
          } while (info->output_scanline < info->output_height);
        }
      }
      else {
LAB_00106791:
        ppJVar16 = (*info->mem->alloc_sarray)
                             ((j_common_ptr)info,1,info->output_components * info->output_width,1);
        jpeg_start_decompress(info);
        do {
          if (info->output_height <= info->output_scanline) break;
          iVar27 = info->output_scanline - local_a8.y1.m_i;
          iVar12 = (local_a8.y2.m_i - local_a8.y1.m_i) + 1;
          if (iVar12 <= iVar27) break;
          jpeg_read_scanlines(info,ppJVar16,1);
          if (-1 < iVar27) {
            if (info->output_components == 3) {
              lVar17 = (long)local_a8.x1.m_i;
              pJVar28 = *ppJVar16;
              pqVar18 = (quint32 *)QImage::scanLine(AVar25);
              (*converter)(pqVar18,pJVar28 + lVar17 * 3,(local_a8.x2.m_i - local_a8.x1.m_i) + 1);
            }
            else if (info->out_color_space == JCS_CMYK) {
              pJVar28 = *ppJVar16 + (local_a8.x1.m_i << 2);
              __dest = (void *)QImage::scanLine(AVar25);
              iVar14 = (local_a8.x2.m_i - local_a8.x1.m_i) + 1;
              if (invertCMYK) {
                if (0 < iVar14) {
                  lVar17 = 0;
                  do {
                    *(uint *)((long)__dest + lVar17 * 4) = ~*(uint *)(pJVar28 + lVar17 * 4);
                    lVar17 = lVar17 + 1;
                  } while ((int)lVar17 < (local_a8.x2.m_i - local_a8.x1.m_i) + 1);
                }
              }
              else {
                iVar14 = iVar14 * 4;
LAB_001068d5:
                memcpy(__dest,pJVar28,(long)iVar14);
              }
            }
            else if (info->output_components == 1) {
              __dest = (void *)QImage::scanLine(AVar25);
              pJVar28 = *ppJVar16 + local_a8.x1.m_i;
              iVar14 = (local_a8.x2.m_i - local_a8.x1.m_i) + 1;
              goto LAB_001068d5;
            }
          }
        } while (iVar27 < iVar12);
      }
      if (info->output_scanline == info->output_height) {
        jpeg_finish_decompress(info);
      }
      if (info->density_unit == '\x02') {
        QImage::setDotsPerMeterX(AVar25);
LAB_00106981:
        QImage::setDotsPerMeterY(AVar25);
      }
      else if (info->density_unit == '\x01') {
        QImage::setDotsPerMeterX(AVar25);
        goto LAB_00106981;
      }
      RVar15.m_i = local_60.ht.m_i;
      if (-1 < (local_60.wd.m_i | local_60.ht.m_i)) {
        if (local_60.wd.m_i == (local_a8.x2.m_i - local_a8.x1.m_i) + 1) {
          if (local_60.ht.m_i == (local_a8.y2.m_i - local_a8.y1.m_i) + 1) goto LAB_00106a43;
        }
        QImage::scaled((QSize *)&local_c0,AVar25,(TransformationMode)&local_60);
        local_48 = 0xaaaaaaaaaaaaaaaa;
        local_58 = (code *)0xaaaaaaaaaaaaaaaa;
        uStack_50 = 0xaaaaaaaaaaaaaaaa;
        QPaintDevice::QPaintDevice((QPaintDevice *)&local_58);
        uVar20 = local_b0;
        local_58 = QString::fromUtf8;
        local_b0 = 0;
        local_48 = *(undefined8 *)(outImage + 0x10);
        *(undefined8 *)(outImage + 0x10) = uVar20;
        QImage::~QImage((QImage *)&local_58);
        RVar15.m_i = QImage::~QImage((QImage *)&local_c0);
      }
LAB_00106a43:
      auVar31._0_4_ = -(uint)(local_78.x2.m_i < local_78.x1.m_i);
      auVar31._4_4_ = auVar31._0_4_;
      auVar31._8_4_ = -(uint)(local_78.y2.m_i < local_78.y1.m_i);
      auVar31._12_4_ = -(uint)(local_78.y2.m_i < local_78.y1.m_i);
      iVar12 = movmskpd(RVar15.m_i,auVar31);
      if (iVar12 == 0) {
        QImage::copy(&local_c0);
        local_48 = 0xaaaaaaaaaaaaaaaa;
        local_58 = (code *)0xaaaaaaaaaaaaaaaa;
        uStack_50 = 0xaaaaaaaaaaaaaaaa;
        QPaintDevice::QPaintDevice((QPaintDevice *)&local_58);
        uVar20 = local_b0;
        local_58 = QString::fromUtf8;
        local_b0 = 0;
        local_48 = *(undefined8 *)(outImage + 0x10);
        *(undefined8 *)(outImage + 0x10) = uVar20;
        QImage::~QImage((QImage *)&local_58);
        QImage::~QImage((QImage *)&local_c0);
      }
      bVar11 = QImage::isNull();
      bVar11 = bVar11 ^ 1;
      goto LAB_001062f7;
    }
  }
  else {
    my_output_message((j_common_ptr)info);
  }
LAB_001062f5:
  bVar11 = 0;
LAB_001062f7:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return (bool)bVar11;
}

Assistant:

static bool read_jpeg_image(QImage *outImage,
                            QSize scaledSize, QRect scaledClipRect,
                            QRect clipRect, int quality,
                            Rgb888ToRgb32Converter converter,
                            j_decompress_ptr info, struct my_error_mgr* err, bool invertCMYK)
{
    if (!setjmp(err->setjmp_buffer)) {
        // -1 means default quality.
        if (quality < 0)
            quality = 75;

        // If possible, merge the scaledClipRect into either scaledSize
        // or clipRect to avoid doing a separate scaled clipping pass.
        // Best results are achieved by clipping before scaling, not after.
        if (!scaledClipRect.isEmpty()) {
            if (scaledSize.isEmpty() && clipRect.isEmpty()) {
                // No clipping or scaling before final clip.
                clipRect = scaledClipRect;
                scaledClipRect = QRect();
            } else if (scaledSize.isEmpty()) {
                // Clipping, but no scaling: combine the clip regions.
                scaledClipRect.translate(clipRect.topLeft());
                clipRect = scaledClipRect.intersected(clipRect);
                scaledClipRect = QRect();
            } else if (clipRect.isEmpty()) {
                // No clipping, but scaling: if we can map back to an
                // integer pixel boundary, then clip before scaling.
                if ((info->image_width % scaledSize.width()) == 0 &&
                        (info->image_height % scaledSize.height()) == 0) {
                    int x = scaledClipRect.x() * info->image_width /
                            scaledSize.width();
                    int y = scaledClipRect.y() * info->image_height /
                            scaledSize.height();
                    int width = (scaledClipRect.right() + 1) *
                                info->image_width / scaledSize.width() - x;
                    int height = (scaledClipRect.bottom() + 1) *
                                 info->image_height / scaledSize.height() - y;
                    clipRect = QRect(x, y, width, height);
                    scaledSize = scaledClipRect.size();
                    scaledClipRect = QRect();
                }
            } else {
                // Clipping and scaling: too difficult to figure out,
                // and not a likely use case, so do it the long way.
            }
        }

        // Determine the scale factor to pass to libjpeg for quick downscaling.
        if (!scaledSize.isEmpty() && info->image_width && info->image_height) {
            if (clipRect.isEmpty()) {
                double f = qMin(double(info->image_width) / scaledSize.width(),
                                double(info->image_height) / scaledSize.height());

                // libjpeg supports M/8 scaling with M=[1,16]. All downscaling factors
                // are a speed improvement, but upscaling during decode is slower.
                info->scale_num   = qBound(1, qCeil(8/f), 8);
                info->scale_denom = 8;
            } else {
                info->scale_denom = qMin(clipRect.width() / scaledSize.width(),
                                         clipRect.height() / scaledSize.height());

                // Only scale by powers of two when clipping so we can
                // keep the exact pixel boundaries
                if (info->scale_denom < 2)
                    info->scale_denom = 1;
                else if (info->scale_denom < 4)
                    info->scale_denom = 2;
                else if (info->scale_denom < 8)
                    info->scale_denom = 4;
                else
                    info->scale_denom = 8;
                info->scale_num = 1;

                // Correct the scale factor so that we clip accurately.
                // It is recommended that the clip rectangle be aligned
                // on an 8-pixel boundary for best performance.
                while (info->scale_denom > 1 &&
                       ((clipRect.x() % info->scale_denom) != 0 ||
                        (clipRect.y() % info->scale_denom) != 0 ||
                        (clipRect.width() % info->scale_denom) != 0 ||
                        (clipRect.height() % info->scale_denom) != 0)) {
                    info->scale_denom /= 2;
                }
            }
        }

        // If high quality not required, use fast decompression
        if ( quality < HIGH_QUALITY_THRESHOLD ) {
            info->dct_method = JDCT_IFAST;
            info->do_fancy_upsampling = FALSE;
        }

        (void) jpeg_calc_output_dimensions(info);

        // Determine the clip region to extract.
        QRect imageRect(0, 0, info->output_width, info->output_height);
        QRect clip;
        if (clipRect.isEmpty()) {
            clip = imageRect;
        } else if (info->scale_denom == info->scale_num) {
            clip = clipRect.intersected(imageRect);
        } else {
            // The scale factor was corrected above to ensure that
            // we don't miss pixels when we scale the clip rectangle.
            clip = QRect(clipRect.x() / int(info->scale_denom),
                         clipRect.y() / int(info->scale_denom),
                         clipRect.width() / int(info->scale_denom),
                         clipRect.height() / int(info->scale_denom));
            clip = clip.intersected(imageRect);
        }

        // Allocate memory for the clipped QImage.
        if (!ensureValidImage(outImage, info, clip.size()))
            return false;

        // Avoid memcpy() overhead if grayscale with no clipping.
        bool quickGray = (info->output_components == 1 &&
                          clip == imageRect);
        if (!quickGray) {
            // Ask the jpeg library to allocate a temporary row.
            // The library will automatically delete it for us later.
            // The libjpeg docs say we should do this before calling
            // jpeg_start_decompress().  We can't use "new" here
            // because we are inside the setjmp() block and an error
            // in the jpeg input stream would cause a memory leak.
            JSAMPARRAY rows = (info->mem->alloc_sarray)
                              ((j_common_ptr)info, JPOOL_IMAGE,
                               info->output_width * info->output_components, 1);

            (void) jpeg_start_decompress(info);

            while (info->output_scanline < info->output_height) {
                int y = int(info->output_scanline) - clip.y();
                if (y >= clip.height())
                    break;      // We've read the entire clip region, so abort.

                (void) jpeg_read_scanlines(info, rows, 1);

                if (y < 0)
                    continue;   // Haven't reached the starting line yet.

                if (info->output_components == 3) {
                    uchar *in = rows[0] + clip.x() * 3;
                    QRgb *out = (QRgb*)outImage->scanLine(y);
                    converter(out, in, clip.width());
                } else if (info->out_color_space == JCS_CMYK) {
                    uchar *in = rows[0] + clip.x() * 4;
                    quint32 *out = (quint32*)outImage->scanLine(y);
                    if (invertCMYK) {
                        for (int i = 0; i < clip.width(); ++i) {
                            *out++ = 0xffffffffu - (in[0] | in[1] << 8 | in[2] << 16 | in[3] << 24);
                            in += 4;
                        }
                    } else {
                        memcpy(out, in, clip.width() * 4);
                    }
                } else if (info->output_components == 1) {
                    // Grayscale.
                    memcpy(outImage->scanLine(y),
                           rows[0] + clip.x(), clip.width());
                }
            }
        } else {
            // Load unclipped grayscale data directly into the QImage.
            (void) jpeg_start_decompress(info);
            while (info->output_scanline < info->output_height) {
                uchar *row = outImage->scanLine(info->output_scanline);
                (void) jpeg_read_scanlines(info, &row, 1);
            }
        }

        if (info->output_scanline == info->output_height)
            (void) jpeg_finish_decompress(info);

        if (info->density_unit == 1) {
            outImage->setDotsPerMeterX(int(100. * info->X_density / 2.54));
            outImage->setDotsPerMeterY(int(100. * info->Y_density / 2.54));
        } else if (info->density_unit == 2) {
            outImage->setDotsPerMeterX(int(100. * info->X_density));
            outImage->setDotsPerMeterY(int(100. * info->Y_density));
        }

        if (scaledSize.isValid() && scaledSize != clip.size()) {
            *outImage = outImage->scaled(scaledSize, Qt::IgnoreAspectRatio, quality >= HIGH_QUALITY_THRESHOLD ? Qt::SmoothTransformation : Qt::FastTransformation);
        }

        if (!scaledClipRect.isEmpty())
            *outImage = outImage->copy(scaledClipRect);
        return !outImage->isNull();
    }
    else {
        my_output_message(j_common_ptr(info));
        return false;
    }
}